

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

type_error *
nlohmann::detail::type_error::create(type_error *__return_storage_ptr__,int id_,string *what_arg)

{
  char *what_arg_00;
  allocator local_81;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string w;
  string *what_arg_local;
  int id__local;
  
  w.field_2._8_8_ = what_arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"type_error",&local_81);
  exception::name(&local_60,&local_80,id_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 w.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  what_arg_00 = (char *)std::__cxx11::string::c_str();
  type_error(__return_storage_ptr__,id_,what_arg_00);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static type_error create(int id_, const std::string& what_arg) {
		std::string w = exception::name("type_error", id_) + what_arg;
		return type_error(id_, w.c_str());
	}